

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

BOOL Js::JavascriptOperators::GetOwnProperty
               (Var instance,PropertyId propertyId,Var *value,ScriptContext *requestContext,
               PropertyValueInfo *propertyValueInfo)

{
  bool bVar1;
  BOOL BVar2;
  RecyclableObject *this;
  bool local_41;
  RecyclableObject *object;
  BOOL result;
  PropertyValueInfo *propertyValueInfo_local;
  ScriptContext *requestContext_local;
  Var *value_local;
  PropertyId propertyId_local;
  Var instance_local;
  
  bVar1 = TaggedNumber::Is(instance);
  if (bVar1) {
    object._4_4_ = 0;
  }
  else {
    this = VarTo<Js::RecyclableObject>(instance);
    local_41 = false;
    if (this != (RecyclableObject *)0x0) {
      BVar2 = RecyclableObject::GetProperty
                        (this,this,propertyId,value,propertyValueInfo,requestContext);
      local_41 = BVar2 != 0;
    }
    object._4_4_ = (uint)local_41;
    if ((propertyValueInfo != (PropertyValueInfo *)0x0) && (object._4_4_ != 0)) {
      CacheOperators::CachePropertyRead
                (instance,this,false,propertyId,false,propertyValueInfo,requestContext);
    }
  }
  return object._4_4_;
}

Assistant:

BOOL JavascriptOperators::GetOwnProperty(Var instance, PropertyId propertyId, Var* value, ScriptContext* requestContext, PropertyValueInfo * propertyValueInfo)
    {
        BOOL result;
        if (TaggedNumber::Is(instance))
        {
            result = false;
        }
        else
        {
            RecyclableObject* object = VarTo<RecyclableObject>(instance);
            result = object && object->GetProperty(object, propertyId, value, propertyValueInfo, requestContext);

            if (propertyValueInfo && result)
            {
                // We can only update the cache in case a property was found, because if it wasn't found, we don't know if it is missing or on a prototype
                CacheOperators::CachePropertyRead(instance, object, false /* isRoot */, propertyId, false /* isMissing */, propertyValueInfo, requestContext);
            }
        }
        return result;
    }